

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

TPZFMatrix<double> *
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TensorProd<double>
          (TPZFMatrix<double> *__return_storage_ptr__,TPZFMatrix<double> *vec1,
          TPZFMatrix<double> *vec2)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int j;
  long row;
  int i;
  long row_00;
  double local_118;
  TPZFNMatrix<9,_double> res;
  
  local_118 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&res,3,3,&local_118);
  for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
    for (row = 0; row != 3; row = row + 1) {
      pdVar3 = TPZFMatrix<double>::operator()(vec1,row_00,0);
      dVar1 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(vec2,row,0);
      dVar2 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()(&res.super_TPZFMatrix<double>,row_00,row);
      *pdVar3 = dVar1 * dVar2;
    }
  }
  TPZFMatrix<double>::TPZFMatrix(__return_storage_ptr__,&res.super_TPZFMatrix<double>);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&res);
  return __return_storage_ptr__;
}

Assistant:

static TPZFMatrix<T> TensorProd(TPZFMatrix<T> &vec1, TPZFMatrix<T> &vec2)
        {
            TPZFNMatrix<9,T> res(3,3,0.);
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < 3; j++) {
                    res(i,j) = vec1(i,0) * vec2(j,0);
                }
            }
            return res;
        }